

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

TimeSamples *
tinyusdz::tydra::anon_unknown_6::ToTypelessTimeSamples<int>
          (TimeSamples *__return_storage_ptr__,TypedTimeSamples<int> *ts)

{
  double t;
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  Value local_48;
  ulong local_30;
  size_t i;
  vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
  *local_20;
  vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
  *samples;
  TypedTimeSamples<int> *ts_local;
  TimeSamples *dst;
  
  samples = &ts->_samples;
  ts_local = (TypedTimeSamples<int> *)__return_storage_ptr__;
  local_20 = TypedTimeSamples<int>::get_samples(ts);
  i._7_1_ = 0;
  tinyusdz::value::TimeSamples::TimeSamples(__return_storage_ptr__);
  for (local_30 = 0; uVar1 = local_30,
      sVar2 = ::std::
              vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
              ::size(local_20), uVar1 < sVar2; local_30 = local_30 + 1) {
    pvVar3 = ::std::
             vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
             ::operator[](local_20,local_30);
    t = pvVar3->t;
    pvVar3 = ::std::
             vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
             ::operator[](local_20,local_30);
    tinyusdz::value::Value::Value<int>(&local_48,&pvVar3->value);
    tinyusdz::value::TimeSamples::add_sample(__return_storage_ptr__,t,&local_48);
    tinyusdz::value::Value::~Value(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

value::TimeSamples ToTypelessTimeSamples(const TypedTimeSamples<T> &ts) {
  const std::vector<typename TypedTimeSamples<T>::Sample> &samples =
      ts.get_samples();

  value::TimeSamples dst;

  for (size_t i = 0; i < samples.size(); i++) {
    dst.add_sample(samples[i].t, samples[i].value);
  }

  return dst;
}